

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markethandler.h
# Opt level: O0

void __thiscall
hedg::Market_Handler::update_lay
          (Market_Handler *this,string *market_id,int runner_id,int level,Bid *bid)

{
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *pmVar1;
  reference this_02;
  pointer this_03;
  Bid *bid_local;
  int level_local;
  int runner_id_local;
  string *market_id_local;
  Market_Handler *this_local;
  
  bid_local._0_4_ = level;
  bid_local._4_4_ = runner_id;
  _level_local = market_id;
  market_id_local = (string *)this;
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>_>_>_>
            ::operator[](&this->market_book,market_id);
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
            ::operator[](&this->runner_loc,market_id);
  pmVar1 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](this_01,(key_type *)((long)&bid_local + 4));
  this_02 = std::
            vector<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>,_std::allocator<std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>_>_>
            ::operator[](this_00,(long)*pmVar1);
  this_03 = std::unique_ptr<hedg::Order_Book,_std::default_delete<hedg::Order_Book>_>::operator->
                      (this_02);
  Order_Book::update_lay(this_03,(int)bid_local,bid);
  return;
}

Assistant:

void update_lay(std::string market_id, int runner_id, int level, Bid& bid) {
		market_book[market_id][runner_loc[market_id][runner_id]]->update_lay(level, bid);
	}